

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O3

int CheckInput(int *param_1)

{
  fd_set readfds;
  timeval local_98;
  fd_set local_88;
  
  local_88.fds_bits[1] = 0;
  local_88.fds_bits[2] = 0;
  local_88.fds_bits[3] = 0;
  local_88.fds_bits[4] = 0;
  local_88.fds_bits[5] = 0;
  local_88.fds_bits[6] = 0;
  local_88.fds_bits[7] = 0;
  local_88.fds_bits[8] = 0;
  local_88.fds_bits[9] = 0;
  local_88.fds_bits[10] = 0;
  local_88.fds_bits[0xb] = 0;
  local_88.fds_bits[0xc] = 0;
  local_88.fds_bits[0xd] = 0;
  local_88.fds_bits[0xe] = 0;
  local_88.fds_bits[0xf] = 0;
  local_88.fds_bits[0] = 1;
  local_98.tv_sec = 0;
  local_98.tv_usec = 0;
  select(0x10,&local_88,(fd_set *)0x0,(fd_set *)0x0,&local_98);
  return (uint)local_88.fds_bits[0] & 1;
}

Assistant:

int /* bool */ CheckInput(int &) {
    fd_set readfds;
    timeval tv;
    int /* bool */ data;
    FD_ZERO(&readfds);
    FD_SET(0, &readfds);
    tv.tv_sec = 0;
    tv.tv_usec = 0;
    select(16, &readfds, 0, 0, &tv);
    data = FD_ISSET(0, &readfds);
    return data;
}